

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  future<unsigned_long> local_20;
  
  std::async<unsigned_long(&)(unsigned_long),unsigned_long_const&>
            ((launch)&local_20,(_func_unsigned_long_unsigned_long *)0x1,
             (unsigned_long *)anon_unknown.dwarf_ae34::call_function);
  std::future<unsigned_long>::get(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___basic_future<unsigned_long>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  poVar1 = std::operator<<((ostream *)&std::cout,"Factorial(20) => ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," == ");
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  poVar1 = std::operator<<(poVar1," <= Should be");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of calls should be #");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int, char **)
{
  const auto result = std::async(std::launch::async, call_function, N).get();

  std::cout << "Factorial(20) => " << result << " == " << 2432902008176640000ull << " <= Should be" << std::endl;
  std::cout << "Number of calls should be #" << N << std::endl;

  return 0;
}